

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macThread.c
# Opt level: O3

void * authenticateMAC(void *parameters)

{
  long *plVar1;
  ThreefishKey_t *key;
  long lVar2;
  size_t __n;
  _Bool _Var3;
  int iVar4;
  uint64_t *header;
  undefined8 *puVar5;
  chunk *pcVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  
  if (**(char **)((long)parameters + 8) == '\x01') {
    bVar9 = true;
    bVar10 = false;
    pcVar6 = (chunk *)0x0;
    lVar8 = 0;
    do {
      if (**(int **)((long)parameters + 0x18) != 0) break;
      if (pcVar6 == (chunk *)0x0) {
        pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x28));
        pcVar6 = front(*(queue **)((long)parameters + 0x38));
        if ((pcVar6 != (chunk *)0x0) &&
           (pcVar6 = front(*(queue **)((long)parameters + 0x38)), pcVar6 != (chunk *)0x0)) {
          if (pcVar6->action != '\x06') {
            deque(*(queue **)((long)parameters + 0x38));
          }
          pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x28));
          goto LAB_0010541b;
        }
        pcVar6 = (chunk *)0x0;
        puVar5 = (undefined8 *)((long)parameters + 0x28);
LAB_00105591:
        pthread_mutex_unlock((pthread_mutex_t *)*puVar5);
      }
      else {
LAB_0010541b:
        if ((byte)(pcVar6->action - 5) < 2) break;
        if (bVar9) {
          key = *(ThreefishKey_t **)((long)parameters + 0x50);
          uVar11 = key->stateSize >> 3;
          header = (uint64_t *)calloc(2,uVar11);
          if (header == (uint64_t *)0x0) goto LAB_00105700;
          __n = uVar11 * 2;
          memcpy(header,pcVar6->data,__n);
          decryptHeader(key,header);
          _Var3 = checkHeader(header,*(uint64_t **)((long)parameters + 0x58),
                              **(SkeinSize_t **)((long)parameters + 0x50));
          if (!_Var3) {
            **(undefined4 **)((long)parameters + 0x18) = 0xfffffffb;
            destroyChunk(pcVar6);
            goto LAB_001056f9;
          }
          lVar8 = lVar8 + __n;
          **(undefined1 **)((long)parameters + 0x10) = 1;
          free(header);
        }
        if (!bVar10) {
          lVar2 = *(long *)((long)parameters + 0x20);
          pcVar6->action = *(uint8_t *)(lVar2 + 0x1b0);
          skeinUpdate(*(SkeinCtx_t **)(lVar2 + 0x1a8),(uint8_t *)pcVar6->data,pcVar6->data_size);
          lVar8 = lVar8 + pcVar6->data_size;
          bVar10 = true;
        }
        _Var3 = queueIsFull(*(queue **)((long)parameters + 0x40));
        if (!_Var3) {
          while (_Var3 = queueIsFull(*(queue **)((long)parameters + 0x40)), _Var3) {
            nanosleep((timespec *)&wait_interval,(timespec *)0x0);
          }
          pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x30));
          _Var3 = enque(pcVar6,*(queue **)((long)parameters + 0x40));
          bVar9 = false;
          puVar5 = (undefined8 *)((long)parameters + 0x30);
          if (_Var3) {
            pcVar6 = (chunk *)0x0;
            bVar10 = bVar9;
          }
          goto LAB_00105591;
        }
        bVar9 = false;
      }
      if (lVar8 == 0) {
LAB_001055c0:
        lVar8 = 0;
      }
      else {
        iVar4 = pthread_mutex_trylock(*(pthread_mutex_t **)(*(long *)((long)parameters + 0x48) + 8))
        ;
        if (iVar4 == 0) {
          lVar2 = *(long *)((long)parameters + 0x48);
          plVar1 = (long *)(lVar2 + 0x18);
          *plVar1 = *plVar1 + lVar8;
          pthread_mutex_unlock(*(pthread_mutex_t **)(lVar2 + 8));
          goto LAB_001055c0;
        }
      }
    } while (**(char **)((long)parameters + 8) != '\0');
  }
  lVar8 = *(long *)((long)parameters + 0x20);
  header = (uint64_t *)calloc(*(size_t *)(lVar8 + 0x1c0),1);
  if (header == (uint64_t *)0x0) {
LAB_00105700:
    **(undefined4 **)((long)parameters + 0x18) = 0xfffffff4;
  }
  else {
    skeinFinal(*(SkeinCtx_t **)(lVar8 + 0x1a8),(uint8_t *)header);
    do {
      if ((**(char **)((long)parameters + 8) != '\x01') ||
         (**(int **)((long)parameters + 0x18) != 0)) goto LAB_001056ec;
      pcVar6 = front(*(queue **)((long)parameters + 0x38));
      if (pcVar6 == (chunk *)0x0) {
        pcVar6 = (chunk *)0x0;
      }
      else {
        pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x28));
        pcVar6 = front(*(queue **)((long)parameters + 0x38));
        if (pcVar6 != (chunk *)0x0) {
          deque(*(queue **)((long)parameters + 0x38));
        }
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x28));
      }
    } while (pcVar6 == (chunk *)0x0);
    if (pcVar6->action == '\x06') {
      uVar11 = *(ulong *)(*(long *)((long)parameters + 0x20) + 0x1c0);
      if (7 < uVar11) {
        uVar7 = 0;
        do {
          if (header[uVar7] != pcVar6->data[uVar7]) {
            **(undefined4 **)((long)parameters + 0x18) = 0xfffffff6;
            free(header);
            destroyChunk(pcVar6);
            return (void *)0x0;
          }
          uVar7 = uVar7 + 1;
        } while (uVar11 >> 3 != uVar7);
      }
      _Var3 = queueIsFull(*(queue **)((long)parameters + 0x40));
      if (_Var3) {
        do {
          nanosleep((timespec *)&wait_interval,(timespec *)0x0);
          _Var3 = queueIsFull(*(queue **)((long)parameters + 0x40));
        } while (_Var3);
      }
      pthread_mutex_lock(*(pthread_mutex_t **)((long)parameters + 0x30));
      _Var3 = queueDone(*(queue **)((long)parameters + 0x40));
      if (!_Var3) {
        **(undefined4 **)((long)parameters + 0x18) = 0xfffffff1;
        return (void *)0x0;
      }
      pthread_mutex_unlock(*(pthread_mutex_t **)((long)parameters + 0x30));
      destroyChunk(pcVar6);
    }
    else {
LAB_001056ec:
      **(undefined4 **)((long)parameters + 0x18) = 0xfffffff6;
    }
LAB_001056f9:
    free(header);
  }
  return (void *)0x0;
}

Assistant:

void* authenticateMAC(void* parameters)
{
    pdebug("authenticateMAC()\n");
    bool header = true;
    bool maced = false;
    chunk* mac_chunk = NULL;    
    macParams* params = parameters;
    uint64_t mac_progress = 0;
 
    while (*(params->running) && *(params->error) == 0)
    {
        //get the next chunk
        if (mac_chunk == NULL)
        {
            pthread_mutex_lock(params->in_mutex);
            if (front(params->in) != NULL)
            {
                pdebug("*** attempting to deque chunk to mac ***\n");
                mac_chunk = front(params->in);
                if (mac_chunk != NULL && mac_chunk->action != MAC)
                { deque(params->in); } //if the operation succeeded deque the chunk
            }
            pthread_mutex_unlock(params->in_mutex);
        }

        //check for loop termination conditions
        if (mac_chunk != NULL && (mac_chunk->action == MAC ||
            mac_chunk->action == DONE))
        { break; }

        //check the header
        if (mac_chunk != NULL && header)
        {
            pdebug("*** checking header ***\n");
            const uint64_t block_byte_size = (params->tf_key->stateSize)/8;
            uint64_t* test_header = calloc(2, block_byte_size);

            if (test_header == NULL) //Sanity check 
            {
                *(params->error) = MEMORY_ALLOCATION_FAIL;
                return NULL;
            }
            /* test the header in a buffer so we can keep the original header encrypted
             * in memory*/
            memcpy(test_header, mac_chunk->data, 2*block_byte_size);
            decryptHeader(params->tf_key, test_header);

            if (!checkHeader(test_header, params->file_size, params->tf_key->stateSize))
            {
                pdebug("*** Header check failed ***\n");
                pdebug("*** Ran header check on chunk of size %lu ***\n", mac_chunk->data_size);
                *(params->error) = HEADER_CHECK_FAIL; //set the error flag
		        destroyChunk(mac_chunk); //free any resources that are not in the queue
                if (test_header != NULL) { free(test_header); }

                return NULL;
            }

            pdebug("*** Header check succeeded ***\n");
            header = false;
            mac_progress += 2*block_byte_size;
            //signal to other processes that the header is valid
            *(params->valid) = true;
             
            if (test_header != NULL) { free(test_header); }
        }

        if (mac_chunk != NULL && !maced) //mac the chunk
        {
            pdebug("*** Updating mac on chunk of size %lu ***\n", mac_chunk->data_size);
            mac_chunk->action = params->mac_context->out_action; 
            skeinUpdate(params->mac_context->skein_context_ptr,
                        (const uint8_t*)mac_chunk->data,
                        mac_chunk->data_size);

	        mac_progress += mac_chunk->data_size;
            maced = true;
        }

        //attempt to queue the chunk
        if (mac_chunk != NULL && maced && !queueIsFull(params->out))
        {
            pdebug("*** Queuing chunk of size %lu ***\n", mac_chunk->data_size);
	        while (queueIsFull(params->out)) { nanosleep(&wait_interval, NULL); }
            
            pthread_mutex_lock(params->out_mutex);
            if (enque(mac_chunk, params->out))
            {
                maced = false;
                mac_chunk = NULL;
            }
            pthread_mutex_unlock(params->out_mutex);
        }
        
	    if (mac_progress > 0)
        {
	        if (pthread_mutex_trylock(params->progress->progress_mutex) == 0)
	        {
	            params->progress->progress += mac_progress;
		        mac_progress = 0;
		        pthread_mutex_unlock(params->progress->progress_mutex);
	        }
	    }
    } //end while loop

    pdebug("*** authenticateMAC() done with first loop ***\n");
    //allocates storage for the calculated mac
    uint64_t* calculated_mac = calloc(params->mac_context->digest_byte_size,
                                      sizeof(uint8_t));

    if (calculated_mac == NULL) //Sanity check 
    {
        *(params->error) = MEMORY_ALLOCATION_FAIL;

        return NULL;
    }
    
    pdebug("*** Calculating MAC ***\n"); 
    skeinFinal(params->mac_context->skein_context_ptr, (uint8_t*)calculated_mac);
    chunk* stored_mac_chunk = NULL;

    //attempt to get the MAC appended to the end of the file
    while (*(params->running) && *(params->error) == 0)
    {
        //dequeue the mac chunk
        if (stored_mac_chunk == NULL && front(params->in) != NULL)
        {
            pdebug("*** Reading stored MAC ***\n");
            pthread_mutex_lock(params->in_mutex);
            stored_mac_chunk = front(params->in);
            if (stored_mac_chunk != NULL) { deque(params->in); }
            pthread_mutex_unlock(params->in_mutex);
        }

        if (stored_mac_chunk != NULL) { break; } //check for the termination condition
    }

    if (stored_mac_chunk == NULL || stored_mac_chunk->action != MAC)
    {
        pdebug("*** Unable to queue stored mac chunk ***\n");
        *(params->error) = MAC_CHECK_FAIL;
        if (calculated_mac != NULL) { free(calculated_mac); }

        return NULL;
    }

    uint64_t* stored_mac = stored_mac_chunk->data; 

    //compare the calculated and stored mac return an error if they don't match
    for (size_t i=0; i<(params->mac_context->digest_byte_size/8); ++i)
    {
        if (calculated_mac[i] != stored_mac[i])
        {
            pdebug("*** MAC check failed. File has been tampered with or was not encrypted with this program ***\n");
            *(params->error) = MAC_CHECK_FAIL;
            free(calculated_mac);
            destroyChunk(stored_mac_chunk);

            return NULL;
        } //if control falls through the MAC is valid
    }

    pdebug("*** MAC check passed ***\n");
    //queue Done flag
    while (queueIsFull(params->out)) { nanosleep(&wait_interval, NULL); } //wait until the queue is free 
    pthread_mutex_lock(params->out_mutex);
    if (!queueDone(params->out))
    {
        pdebug("Error queueing done\n");
        *(params->error) = QUEUE_OPERATION_FAIL;

        return NULL;
    }
    pthread_mutex_unlock(params->out_mutex);
    pdebug("*** Done queued *** \n");

    //free any remaining allocated resources
    if (stored_mac_chunk != NULL) { destroyChunk(stored_mac_chunk); }
    if (calculated_mac != NULL) { free(calculated_mac); }

    return NULL;
}